

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O3

int demoCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tm *ptVar4;
  time_t tt;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar4 = gmtime(&tStack_18);
  if (ptVar4 != (tm *)0x0) {
    pOut->tm_mon = ptVar4->tm_mon;
    iVar1 = ptVar4->tm_min;
    iVar2 = ptVar4->tm_hour;
    iVar3 = ptVar4->tm_mday;
    pOut->tm_sec = ptVar4->tm_sec;
    pOut->tm_min = iVar1;
    pOut->tm_hour = iVar2;
    pOut->tm_mday = iVar3;
    pOut->tm_year = ptVar4->tm_year + 0x76c;
    iVar1 = ptVar4->tm_yday;
    pOut->tm_wday = ptVar4->tm_wday;
    pOut->tm_yday = iVar1;
    pOut->tm_isdst = ptVar4->tm_isdst;
    pOut->tm_zone = (char *)0x0;
    pOut->tm_gmtoff = 0;
  }
  return 0;
}

Assistant:

static int demoCurrentTime(unqlite_vfs *pVfs, Sytm *pOut){
	time_t tt;
#if defined(_MSC_VER) || defined(__MINGW32__)
    errno_t err;
    struct tm pTm;
#else
    struct tm *pTm;
#endif  /* defined(_MSC_VER) || defined(__MINGW32__) */
	time(&tt);
#if defined(_MSC_VER) || defined(__MINGW32__)
    err = gmtime_s(&pTm, &tt);
    if ( !err ) {
        STRUCT_TM_TO_SYTM(&pTm,pOut);
    }
#else
	pTm = gmtime(&tt);
	if( pTm ){ /* Yes, it can fail */
		STRUCT_TM_TO_SYTM(pTm,pOut);
	}
#endif  /* defined(_MSC_VER) || defined(__MINGW32__) */
	return UNQLITE_OK;
}